

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  Bool BVar1;
  char *property;
  Node *pNStack_40;
  Bool wasblock;
  Node *lastli;
  Node *parent;
  Node *node;
  Lexer *lexer;
  Node *pNStack_18;
  GetTokenMode mode_local;
  Node *list_local;
  TidyDocImpl *doc_local;
  
  node = (Node *)doc->lexer;
  if ((list->tag->model & 1) == 0) {
    ((Lexer *)node)->insert = (IStack *)0x0;
    lexer._4_4_ = mode;
    pNStack_18 = list;
    list_local = &doc->root;
    while (parent = prvTidyGetToken((TidyDocImpl *)list_local,IgnoreWhitespace),
          parent != (Node *)0x0) {
      if ((parent->tag == pNStack_18->tag) && (parent->type == EndTag)) {
        prvTidyFreeNode((TidyDocImpl *)list_local,parent);
        pNStack_18->closed = yes;
        return;
      }
      BVar1 = InsertMisc(pNStack_18,parent);
      if (BVar1 == no) {
        if ((parent->type == TextNode) || (parent->tag != (Dict *)0x0)) {
          if (parent->type == EndTag) {
            if (((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
               (parent->tag->id != TidyTag_FORM)) {
              BVar1 = prvTidynodeHasCM(parent,0x10);
              if (BVar1 == no) {
                lastli = pNStack_18->parent;
                while ((lastli != (Node *)0x0 &&
                       (((lastli == (Node *)0x0 || (lastli->tag == (Dict *)0x0)) ||
                        (lastli->tag->id != TidyTag_BODY))))) {
                  if (parent->tag == lastli->tag) {
                    prvTidyReportError((TidyDocImpl *)list_local,pNStack_18,parent,0xcf);
                    prvTidyUngetToken((TidyDocImpl *)list_local);
                    return;
                  }
                  lastli = lastli->parent;
                }
                prvTidyReportError((TidyDocImpl *)list_local,pNStack_18,parent,0xd0);
                prvTidyFreeNode((TidyDocImpl *)list_local,parent);
              }
              else {
                prvTidyReportError((TidyDocImpl *)list_local,pNStack_18,parent,0xd0);
                prvTidyPopInline((TidyDocImpl *)list_local,parent);
                prvTidyFreeNode((TidyDocImpl *)list_local,parent);
              }
            }
            else {
              BadForm((TidyDocImpl *)list_local);
              prvTidyReportError((TidyDocImpl *)list_local,pNStack_18,parent,0xd0);
              prvTidyFreeNode((TidyDocImpl *)list_local,parent);
            }
          }
          else {
            if (((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
               (parent->tag->id != TidyTag_LI)) {
              prvTidyUngetToken((TidyDocImpl *)list_local);
              BVar1 = prvTidynodeHasCM(parent,8);
              if ((BVar1 != no) && (*(int *)((long)&node->next + 4) != 0)) {
                prvTidyReportError((TidyDocImpl *)list_local,pNStack_18,parent,0xcf);
                return;
              }
              if (*(int *)&node->content != 0) {
                BVar1 = prvTidynodeHasCM(parent,0x380);
                if (BVar1 != no) {
                  return;
                }
                if (((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
                   (parent->tag->id == TidyTag_TABLE)) {
                  return;
                }
              }
              if ((((pNStack_18 == (Node *)0x0) || (pNStack_18->tag == (Dict *)0x0)) ||
                  (pNStack_18->tag->id != TidyTag_OL)) ||
                 (BVar1 = FindLastLI(pNStack_18,&stack0xffffffffffffffc0), BVar1 == no)) {
                BVar1 = prvTidynodeHasCM(parent,8);
                parent = prvTidyInferredTag((TidyDocImpl *)list_local,TidyTag_LI);
                property = "list-style: none";
                if (BVar1 != no) {
                  property = "list-style: none; display: inline";
                }
                prvTidyAddStyleProperty((TidyDocImpl *)list_local,parent,property);
                prvTidyReportError((TidyDocImpl *)list_local,pNStack_18,parent,0xd4);
                prvTidyInsertNodeAtEnd(pNStack_18,parent);
              }
              else {
                parent = prvTidyInferredTag((TidyDocImpl *)list_local,TidyTag_LI);
                prvTidyReportError((TidyDocImpl *)list_local,pNStack_18,parent,0xd4);
                prvTidyFreeNode((TidyDocImpl *)list_local,parent);
                parent = pNStack_40;
              }
            }
            else {
              prvTidyInsertNodeAtEnd(pNStack_18,parent);
            }
            ParseTag((TidyDocImpl *)list_local,parent,IgnoreWhitespace);
          }
        }
        else {
          prvTidyReportError((TidyDocImpl *)list_local,pNStack_18,parent,0xd0);
          prvTidyFreeNode((TidyDocImpl *)list_local,parent);
        }
      }
    }
    prvTidyReportError((TidyDocImpl *)list_local,pNStack_18,(Node *)0x0,0xce);
  }
  return;
}

Assistant:

void TY_(ParseList)(TidyDocImpl* doc, Node *list, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent, *lastli;
    Bool wasblock;

    if (list->tag->model & CM_EMPTY)
        return;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (node->type != TextNode && node->tag == NULL)
        {
            TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            if (TY_(nodeHasCM)(node,CM_INLINE))
            {
                TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(PopInline)( doc, node );
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = list->parent;
                  parent != NULL; parent = parent->parent )
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1053626. */
                if (nodeIsBODY(parent))
                    break;
                if (node->tag == parent->tag)
                {
                    TY_(ReportError)(doc, list, node, MISSING_ENDTAG_BEFORE);
                    TY_(UngetToken)( doc );
                    return;
                }
            }

            TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsLI(node) )
        {
            TY_(UngetToken)( doc );

            if (TY_(nodeHasCM)(node,CM_BLOCK) && lexer->excludeBlocks)
            {
                TY_(ReportError)(doc, list, node, MISSING_ENDTAG_BEFORE);
                return;
            }
            /* http://tidy.sf.net/issue/1316307 */
            /* In exiled mode, return so table processing can continue. */
            else if ( lexer->exiled
                      && (TY_(nodeHasCM)(node, CM_TABLE|CM_ROWGRP|CM_ROW)
                          || nodeIsTABLE(node)) )
                return;

            /* http://tidy.sf.net/issue/836462
               If "list" is an unordered list, insert the next tag within 
               the last <li> to preserve the numbering to match the visual 
               rendering of most browsers. */    
            if ( nodeIsOL(list) && FindLastLI(list, &lastli) )
            {
                /* Create a node for error reporting */
                node = TY_(InferredTag)(doc, TidyTag_LI);
                TY_(ReportError)(doc, list, node, MISSING_STARTTAG );
                TY_(FreeNode)( doc, node);
                node = lastli;
            }
            else
            {
                /* Add an inferred <li> */
                wasblock = TY_(nodeHasCM)(node,CM_BLOCK);
                node = TY_(InferredTag)(doc, TidyTag_LI);
                /* Add "display: inline" to avoid a blank line after <li> with 
                   Internet Explorer. See http://tidy.sf.net/issue/836462 */
                TY_(AddStyleProperty)( doc, node,
                                       wasblock
                                       ? "list-style: none; display: inline"
                                       : "list-style: none" 
                                       );
                TY_(ReportError)(doc, list, node, MISSING_STARTTAG );
                TY_(InsertNodeAtEnd)(list,node);
            }
        }
        else
            /* node is <LI> */
            TY_(InsertNodeAtEnd)(list,node);

        ParseTag( doc, node, IgnoreWhitespace);
    }

    TY_(ReportError)(doc, list, node, MISSING_ENDTAG_FOR);
}